

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_189ea5b::EncodeTxbTest_DISABLED_SpeedTestGetNzMapContexts_Test::TestBody
          (EncodeTxbTest_DISABLED_SpeedTestGetNzMapContexts_Test *this)

{
  uint8_t *puVar1;
  uint uVar2;
  uint uVar3;
  int16_t *scan;
  int iVar4;
  int iVar5;
  int iVar6;
  int64_t iVar7;
  int64_t iVar8;
  ulong uVar9;
  ulong uVar10;
  TX_SIZE tx_size;
  long lVar11;
  aom_usec_timer timer_ref;
  aom_usec_timer timer;
  aom_usec_timer local_70;
  aom_usec_timer local_50;
  
  puts("Note: Only test the largest possible eob case!");
  puVar1 = (this->super_EncodeTxbTest).levels_buf_;
  for (lVar11 = 0; lVar11 != 0x13; lVar11 = lVar11 + 1) {
    tx_size = (TX_SIZE)lVar11;
    iVar4 = get_txb_bhl(tx_size);
    iVar5 = get_txb_wide(tx_size);
    iVar6 = get_txb_high(tx_size);
    uVar2 = ::tx_size_wide[lVar11];
    uVar3 = ::tx_size_high[lVar11];
    scan = av1_scan_orders[lVar11][0].scan;
    iVar6 = iVar6 * iVar5;
    uVar9 = 2000000000 / (long)iVar6 & 0xffffffff;
    (this->super_EncodeTxbTest).levels_ = puVar1;
    EncodeTxbTest::InitDataWithEob(&this->super_EncodeTxbTest,scan,iVar4,iVar6);
    ::aom_usec_timer_start(&local_70);
    if ((int)(2000000000 / (long)iVar6) < 1) {
      uVar9 = 0;
    }
    uVar10 = uVar9;
    while (iVar5 = (int)uVar10, uVar10 = (ulong)(iVar5 - 1), iVar5 != 0) {
      av1_get_nz_map_contexts_c
                ((this->super_EncodeTxbTest).levels_,scan,(uint16_t)iVar6,tx_size,'\0',
                 (this->super_EncodeTxbTest).coeff_contexts_ref_);
    }
    ::aom_usec_timer_mark(&local_70);
    (this->super_EncodeTxbTest).levels_ = puVar1;
    EncodeTxbTest::InitDataWithEob(&this->super_EncodeTxbTest,scan,iVar4,iVar6);
    ::aom_usec_timer_start(&local_50);
    while (iVar4 = (int)uVar9, uVar9 = (ulong)(iVar4 - 1), iVar4 != 0) {
      (*(this->super_EncodeTxbTest).get_nz_map_contexts_func_)
                ((this->super_EncodeTxbTest).levels_,scan,(uint16_t)iVar6,tx_size,'\0',
                 (this->super_EncodeTxbTest).coeff_contexts_);
    }
    ::aom_usec_timer_mark(&local_50);
    iVar7 = ::aom_usec_timer_elapsed(&local_70);
    iVar8 = ::aom_usec_timer_elapsed(&local_50);
    printf("get_nz_map_contexts_%2dx%2d: %7.1f ms ref %7.1f ms gain %4.2f\n",
           (double)(int)iVar8 / 1000.0,(double)(int)iVar7 / 1000.0,
           (double)(int)iVar7 / (double)(int)iVar8,(ulong)uVar2,(ulong)uVar3);
  }
  return;
}

Assistant:

TEST_P(EncodeTxbTest, DISABLED_SpeedTestGetNzMapContexts) {
  SpeedTestGetNzMapContextsRun();
}